

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O2

void __thiscall
OpenMD::LDForceModifier::genRandomForceAndTorque
          (LDForceModifier *this,Vector3d *force,Vector3d *torque,uint index)

{
  normal_distribution<double> *this_00;
  Vector<double,_6U> generalForce;
  Vector<double,_6U> Z;
  Vector<double,_6U> local_1e8;
  Vector<double,_6U> local_1b0;
  Vector<double,_6U> local_180;
  RectMatrix<double,_6U,_6U> local_150;
  
  Vector<double,_6U>::Vector(&local_180);
  Vector<double,_6U>::Vector(&local_1e8);
  this_00 = &this->forceDistribution_;
  local_180.data_[0] =
       std::normal_distribution<double>::operator()
                 (this_00,(this->randNumGen_).
                          super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  local_180.data_[1] =
       std::normal_distribution<double>::operator()
                 (this_00,(this->randNumGen_).
                          super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  local_180.data_[2] =
       std::normal_distribution<double>::operator()
                 (this_00,(this->randNumGen_).
                          super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  local_180.data_[3] =
       std::normal_distribution<double>::operator()
                 (this_00,(this->randNumGen_).
                          super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  local_180.data_[4] =
       std::normal_distribution<double>::operator()
                 (this_00,(this->randNumGen_).
                          super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  local_180.data_[5] =
       std::normal_distribution<double>::operator()
                 (this_00,(this->randNumGen_).
                          super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  HydroProp::getS((Mat6x6d *)&local_150,
                  (this->hydroProps_).
                  super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[index]);
  operator*(&local_1b0,&local_150,&local_180);
  Vector<double,_6U>::operator=(&local_1e8,&local_1b0);
  (force->super_Vector<double,_3U>).data_[0] = local_1e8.data_[0];
  (force->super_Vector<double,_3U>).data_[1] = local_1e8.data_[1];
  (force->super_Vector<double,_3U>).data_[2] = local_1e8.data_[2];
  (torque->super_Vector<double,_3U>).data_[0] = local_1e8.data_[3];
  (torque->super_Vector<double,_3U>).data_[1] = local_1e8.data_[4];
  (torque->super_Vector<double,_3U>).data_[2] = local_1e8.data_[5];
  return;
}

Assistant:

void LDForceModifier::genRandomForceAndTorque(Vector3d& force,
                                                Vector3d& torque,
                                                unsigned int index) {
    Vector<RealType, 6> Z;
    Vector<RealType, 6> generalForce;

    Z[0] = forceDistribution_(*randNumGen_);
    Z[1] = forceDistribution_(*randNumGen_);
    Z[2] = forceDistribution_(*randNumGen_);
    Z[3] = forceDistribution_(*randNumGen_);
    Z[4] = forceDistribution_(*randNumGen_);
    Z[5] = forceDistribution_(*randNumGen_);

    generalForce = hydroProps_[index]->getS() * Z;

    force[0]  = generalForce[0];
    force[1]  = generalForce[1];
    force[2]  = generalForce[2];
    torque[0] = generalForce[3];
    torque[1] = generalForce[4];
    torque[2] = generalForce[5];
  }